

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall wirehair::Codec::InitializeEncoderFromDecoder(Codec *this)

{
  Codec *in_RDI;
  WirehairResult result;
  Codec *in_stack_ffffffffffffffd8;
  WirehairResult local_14;
  
  if ((in_RDI->_all_original & 1U) != 0) {
    local_14 = SolveMatrix(in_stack_ffffffffffffffd8);
    if (local_14 != Wirehair_Success) {
      if (local_14 == Wirehair_NeedMore) {
        local_14 = Wirehair_BadPeelSeed;
      }
      return local_14;
    }
    GenerateRecoveryBlocks(in_RDI);
  }
  in_RDI->_input_final_bytes = in_RDI->_output_final_bytes;
  return Wirehair_Success;
}

Assistant:

WirehairResult Codec::InitializeEncoderFromDecoder()
{
    CAT_DEBUG_ASSERT(_row_count >= _block_count);

#if defined(CAT_ALL_ORIGINAL)
    // If all original data, return success (common case)
    if (_all_original)
    {
        // All of the original data was received, but perhaps not in the
        // original order.  When the original data was received by the
        // DecodeFeed() method, it called OpportunisticPeeling() for each
        // of the original data blocks already.  So the solver is already
        // set up, we just need to run it now to generate the recovery set.

        // Solve matrix and generate recovery blocks
        WirehairResult result = SolveMatrix();

        if (result != Wirehair_Success)
        {
            CAT_DEBUG_BREAK();
            if (result == Wirehair_NeedMore) {
                result = Wirehair_BadPeelSeed;
            }
            return result;
        }

        GenerateRecoveryBlocks();
    }
#endif

    // Set input final bytes to output final bytes
    _input_final_bytes = _output_final_bytes;

    return Wirehair_Success;
}